

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXProperties.h
# Opt level: O0

aiVector3t<float>
Assimp::FBX::PropertyGet<aiVector3t<float>>
          (PropertyTable *in,string *name,aiVector3t<float> *defaultValue)

{
  aiVector3t<float> aVar1;
  Property *this;
  TypedProperty<aiVector3t<float>_> *this_00;
  aiVector3t<float> *paVar2;
  TypedProperty<aiVector3t<float>_> *tprop;
  Property *prop;
  aiVector3t<float> *defaultValue_local;
  string *name_local;
  PropertyTable *in_local;
  undefined4 uStack_10;
  float local_c;
  
  this = PropertyTable::Get(in,name);
  if (this == (Property *)0x0) {
    in_local._4_4_ = defaultValue->x;
    uStack_10 = defaultValue->y;
    local_c = defaultValue->z;
  }
  else {
    this_00 = Property::As<Assimp::FBX::TypedProperty<aiVector3t<float>>>(this);
    if (this_00 == (TypedProperty<aiVector3t<float>_> *)0x0) {
      in_local._4_4_ = defaultValue->x;
      uStack_10 = defaultValue->y;
      local_c = defaultValue->z;
    }
    else {
      paVar2 = TypedProperty<aiVector3t<float>_>::Value(this_00);
      in_local._4_4_ = paVar2->x;
      uStack_10 = paVar2->y;
      local_c = paVar2->z;
    }
  }
  aVar1.z = local_c;
  aVar1.x = (float)in_local._4_4_;
  aVar1.y = (float)uStack_10;
  return aVar1;
}

Assistant:

inline 
T PropertyGet(const PropertyTable& in, const std::string& name, const T& defaultValue) {
    const Property* const prop = in.Get(name);
    if( nullptr == prop) {
        return defaultValue;
    }

    // strong typing, no need to be lenient
    const TypedProperty<T>* const tprop = prop->As< TypedProperty<T> >();
    if( nullptr == tprop) {
        return defaultValue;
    }

    return tprop->Value();
}